

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O3

void Commands::Shutdown(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *arguments,Command_Source *from)

{
  long *local_28 [2];
  long local_18 [2];
  
  (*from->_vptr_Command_Source[2])(local_28);
  Console::Wrn("Server shut down by %s",local_28[0]);
  if (local_28[0] != local_18) {
    operator_delete(local_28[0],local_18[0] + 1);
  }
  eoserv_sig_abort = 1;
  return;
}

Assistant:

void Shutdown(const std::vector<std::string>& arguments, Command_Source* from)
{
	(void)arguments;

	Console::Wrn("Server shut down by %s", from->SourceName().c_str());
	eoserv_sig_abort = true;
}